

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

LinkedModel * __thiscall
google::protobuf::Arena::DoCreateMessage<CoreML::Specification::LinkedModel>(Arena *this)

{
  LinkedModel *this_00;
  
  this_00 = (LinkedModel *)
            AllocateAlignedWithHook
                      (this,0x20,(type_info *)&CoreML::Specification::LinkedModel::typeinfo);
  CoreML::Specification::LinkedModel::LinkedModel(this_00,this,false);
  return this_00;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* DoCreateMessage(Args&&... args) {
    return InternalHelper<T>::Construct(
        AllocateInternal(sizeof(T), alignof(T),
                         internal::ObjectDestructor<
                             InternalHelper<T>::is_destructor_skippable::value,
                             T>::destructor,
                         RTTI_TYPE_ID(T)),
        this, std::forward<Args>(args)...);
  }